

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void handle_conn_shutdown(EVmaster master,EVmaster_msg_ptr msg)

{
  uint uVar1;
  EVdfg p_Var2;
  FILE *pFVar3;
  int iVar4;
  __pid_t _Var5;
  int iVar6;
  EVdfg_stone_state p_Var7;
  long lVar8;
  pthread_t pVar9;
  int j;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int target_stone;
  timespec ts;
  char *local_40;
  char *contact_str;
  
  iVar6 = (msg->u).flush_reconfig.reconfig;
  p_Var2 = master->dfg;
  p_Var7 = find_stone_state(iVar6,p_Var2->deployed_state);
  p_Var7->condition = EVstone_Frozen;
  master->state = DFG_Reconfiguring;
  iVar4 = CMtrace_val[0xd];
  if (master->cm->CMTrace_file == (FILE *)0x0) {
    iVar4 = CMtrace_init(master->cm,EVdfgVerbose);
  }
  if (iVar4 != 0) {
    if (CMtrace_PID != 0) {
      pFVar3 = (FILE *)master->cm->CMTrace_file;
      _Var5 = getpid();
      pVar9 = pthread_self();
      fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar9);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)master->cm->CMTrace_file,
            "EVDFG conn_shutdown_handler -  master DFG state is now %s\n",str_state[master->state]);
  }
  fflush((FILE *)master->cm->CMTrace_file);
  if (master->node_fail_handler != (EVmasterFailHandlerFunc)0x0) {
    target_stone = -1;
    contact_str = (char *)0x0;
    iVar4 = CMtrace_val[0xd];
    if (master->cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(master->cm,EVdfgVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar3 = (FILE *)master->cm->CMTrace_file;
        _Var5 = getpid();
        pVar9 = pthread_self();
        fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar9);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fwrite("IN CONN_SHUTDOWN_HANDLER\n",0x19,1,(FILE *)master->cm->CMTrace_file);
    }
    fflush((FILE *)master->cm->CMTrace_file);
    for (uVar11 = 0; lVar8 = (long)p_Var2->stone_count, (long)uVar11 < lVar8; uVar11 = uVar11 + 1) {
      uVar10 = 0;
      while( true ) {
        p_Var7 = p_Var2->deployed_state->stones[uVar11];
        if ((long)p_Var7->out_count <= (long)uVar10) break;
        if (p_Var7->out_links[uVar10] == iVar6) {
          p_Var7 = find_stone_state(iVar6,p_Var2->deployed_state);
          iVar4 = CMtrace_val[0xd];
          if (master->cm->CMTrace_file == (FILE *)0x0) {
            iVar4 = CMtrace_init(master->cm,EVdfgVerbose);
          }
          if (iVar4 != 0) {
            if (CMtrace_PID != 0) {
              pFVar3 = (FILE *)master->cm->CMTrace_file;
              _Var5 = getpid();
              pVar9 = pthread_self();
              fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar9);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&ts);
              fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
            }
            fprintf((FILE *)master->cm->CMTrace_file,
                    "Found reporting stone as output %d of stone %d\n",uVar10 & 0xffffffff,
                    uVar11 & 0xffffffff);
          }
          fflush((FILE *)master->cm->CMTrace_file);
          parse_bridge_action_spec(p_Var7->action,&target_stone,&contact_str);
          iVar4 = CMtrace_val[0xd];
          if (master->cm->CMTrace_file == (FILE *)0x0) {
            iVar4 = CMtrace_init(master->cm,EVdfgVerbose);
          }
          if (iVar4 != 0) {
            if (CMtrace_PID != 0) {
              pFVar3 = (FILE *)master->cm->CMTrace_file;
              _Var5 = getpid();
              pVar9 = pthread_self();
              fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar9);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&ts);
              fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
            }
            fprintf((FILE *)master->cm->CMTrace_file,"Dead stone is %d\n",(ulong)(uint)target_stone)
            ;
          }
          fflush((FILE *)master->cm->CMTrace_file);
        }
        uVar10 = uVar10 + 1;
      }
    }
    local_40 = (char *)0x0;
    for (lVar13 = 0; lVar13 < (int)lVar8; lVar13 = lVar13 + 1) {
      p_Var7 = p_Var2->deployed_state->stones[lVar13];
      if (p_Var7->stone_id == target_stone) {
        uVar1 = p_Var7->node;
        iVar6 = CMtrace_val[0xd];
        if (master->cm->CMTrace_file == (FILE *)0x0) {
          iVar6 = CMtrace_init(master->cm,EVdfgVerbose);
        }
        if (iVar6 != 0) {
          if (CMtrace_PID != 0) {
            pFVar3 = (FILE *)master->cm->CMTrace_file;
            _Var5 = getpid();
            pVar9 = pthread_self();
            fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar9);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)master->cm->CMTrace_file,"Dead node is %d, name %s\n",(ulong)uVar1,
                  master->nodes[(int)uVar1].canonical_name);
        }
        fflush((FILE *)master->cm->CMTrace_file);
        local_40 = master->nodes[(int)uVar1].canonical_name;
        master->nodes[(int)uVar1].shutdown_status_contribution = -3;
        for (lVar12 = 0; lVar8 = (long)p_Var2->stone_count, lVar12 < lVar8; lVar12 = lVar12 + 1) {
          if (p_Var2->deployed_state->stones[lVar12]->node == uVar1) {
            iVar6 = CMtrace_val[0xd];
            if (master->cm->CMTrace_file == (FILE *)0x0) {
              iVar6 = CMtrace_init(master->cm,EVdfgVerbose);
            }
            if (iVar6 != 0) {
              if (CMtrace_PID != 0) {
                pFVar3 = (FILE *)master->cm->CMTrace_file;
                _Var5 = getpid();
                pVar9 = pthread_self();
                fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar9);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,(timespec *)&ts);
                fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
              }
              fprintf((FILE *)master->cm->CMTrace_file,"Dead node is %d, name %s\n",(ulong)uVar1,
                      master->nodes[(int)uVar1].canonical_name);
            }
            fflush((FILE *)master->cm->CMTrace_file);
            p_Var2->deployed_state->stones[lVar12]->condition = EVstone_Lost;
          }
        }
      }
    }
    IntCManager_unlock(master->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                       ,0x447);
    (*master->node_fail_handler)(p_Var2,local_40,target_stone);
    IntCManager_lock(master->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0x449);
    master->reconfig = 1;
    master->sig_reconfig_bool = 1;
    check_all_nodes_registered(master);
  }
  return;
}

Assistant:

static void 
handle_conn_shutdown(EVmaster master, EVmaster_msg_ptr msg)
{
    int stone = msg->u.conn_shutdown.stone;
    EVdfg_stone_state reporting_stone = find_stone_state(stone, master->dfg->deployed_state);
    EVdfg dfg = master->dfg;

    /* this stone is automatically frozen by EVPath */
    reporting_stone->condition = EVstone_Frozen;
    master->state = DFG_Reconfiguring;
    
    CMtrace_out(master->cm, EVdfgVerbose, "EVDFG conn_shutdown_handler -  master DFG state is now %s\n", str_state[master->state]);
    if (master->node_fail_handler != NULL) {
	int i;
	int target_stone = -1;
	char *failed_node = NULL;
	char *contact_str = NULL;
	CMtrace_out(master->cm, EVdfgVerbose, "IN CONN_SHUTDOWN_HANDLER\n");
	for (i=0; i< dfg->stone_count; i++) {
	    int j;
	    for (j = 0; j < dfg->deployed_state->stones[i]->out_count; j++) {
		if (dfg->deployed_state->stones[i]->out_links[j] == stone) {
		    int out_stone_id = dfg->deployed_state->stones[i]->out_links[j];
		    EVdfg_stone_state out_stone = find_stone_state(out_stone_id, dfg->deployed_state);
		    CMtrace_out(master->cm, EVdfgVerbose, "Found reporting stone as output %d of stone %d\n",
				j, i);
		    parse_bridge_action_spec(out_stone->action, 
					     &target_stone, &contact_str);
		    CMtrace_out(master->cm, EVdfgVerbose, "Dead stone is %d\n", target_stone);
		}
	    }
	}
	for (i=0; i< dfg->stone_count; i++) {
	    if (dfg->deployed_state->stones[i]->stone_id == target_stone) {
		int node = dfg->deployed_state->stones[i]->node;
		int j;
		CMtrace_out(master->cm, EVdfgVerbose, "Dead node is %d, name %s\n", node,
			    master->nodes[node].canonical_name);
		failed_node = master->nodes[node].canonical_name;
		master->nodes[node].shutdown_status_contribution = STATUS_FAILED;
		for (j=0; j< dfg->stone_count; j++) {
		    if (dfg->deployed_state->stones[j]->node == node) {;
			CMtrace_out(master->cm, EVdfgVerbose, "Dead node is %d, name %s\n", node,
				    master->nodes[node].canonical_name);
			dfg->deployed_state->stones[j]->condition = EVstone_Lost;
		    }
		}
	    }
	}
	CManager_unlock(master->cm);
	master->node_fail_handler(dfg, failed_node, target_stone);
	CManager_lock(master->cm);
	master->reconfig = 1;
	master->sig_reconfig_bool = 1;
	check_all_nodes_registered(master);
    }
}